

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O0

istream * serialize::read<std::__cxx11::string,std::__cxx11::string>
                    (istream *istream_,
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *container)

{
  ulong uVar1;
  mapped_type *this;
  size_t __nbytes;
  size_t __nbytes_00;
  string local_68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  string local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> key;
  int local_28;
  int local_24;
  int i;
  int size;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *container_local;
  istream *istream__local;
  
  _i = container;
  container_local =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)istream_;
  uVar1 = std::ios::good();
  if (((uVar1 & 1) == 0) || (uVar1 = std::ios::eof(), (uVar1 & 1) != 0)) {
    istream__local = (istream *)container_local;
  }
  else {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::clear(_i);
    read<int>((istream *)container_local,&local_24);
    for (local_28 = 0; local_28 < local_24; local_28 = local_28 + 1) {
      std::__cxx11::string::string(local_48);
      std::__cxx11::string::string(local_68);
      read((int)container_local,local_48,__nbytes);
      read((int)container_local,local_68,__nbytes_00);
      this = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](_i,(key_type *)local_48);
      std::__cxx11::string::operator=((string *)this,local_68);
      std::__cxx11::string::~string(local_68);
      std::__cxx11::string::~string(local_48);
    }
    istream__local = (istream *)container_local;
  }
  return istream__local;
}

Assistant:

static inline  istream& read(istream& istream_, map<K, V>& container)
{
	if (!istream_.good() || istream_.eof())return istream_;
	int size;
	container.clear();
	read(istream_, size);

	for (int i = 0; i < size; ++i)
	{
		K key;
		V value;
		read(istream_, key);

		read(istream_, value);
		container[key] = value;

	}
	return istream_;
}